

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_get_diagnostic_type(tcv_t *tcv,tcv_diagnostic_type_t *diag_type)

{
  _Bool _Var1;
  int local_24;
  int ret;
  tcv_diagnostic_type_t *diag_type_local;
  tcv_t *tcv_local;
  
  local_24 = -0xd;
  _Var1 = tcv_check_and_lock_ok(tcv);
  if ((_Var1) && (diag_type != (tcv_diagnostic_type_t *)0x0)) {
    _Var1 = tcv_is_initialized(tcv);
    if (_Var1) {
      local_24 = (*tcv->fun->get_diagnostic_type)(tcv,diag_type);
    }
    tcv_unlock(tcv);
    tcv_local._4_4_ = local_24;
  }
  else {
    tcv_local._4_4_ = -4;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_get_diagnostic_type(tcv_t *tcv, tcv_diagnostic_type_t *diag_type)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !diag_type)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_diagnostic_type(tcv, diag_type);
	}
	tcv_unlock(tcv);
	return ret;
}